

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O2

string * __thiscall
cpsm::str_cat<std::__cxx11::string>
          (string *__return_storage_ptr__,cpsm *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::operator<<(local_188,(string *)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string str_cat(Args... args) {
  std::stringstream ss;
  str_cat_impl(ss, args...);
  return ss.str();
}